

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O1

void __thiscall
TaprootUtil_ParseTaprootSignDataByPubkey_Test::~TaprootUtil_ParseTaprootSignDataByPubkey_Test
          (TaprootUtil_ParseTaprootSignDataByPubkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TaprootUtil, ParseTaprootSignDataByPubkey) {
  Transaction tx2("0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014161f75636003a870b7a1685abae84eedf8c9527227ac70183c376f7b3a35b07ebcbea14749e58ce1a87565b035b2f3963baa5ae3ede95e89fd607ab7849f208720100000000");
  auto stack = tx2.GetTxIn(0).GetScriptWitness().GetWitness();
  SchnorrSignature sig;
  bool parity = false;
  uint8_t tapleaf_flag = 0;
  SchnorrPubkey pk;
  std::vector<ByteData256> nodes;
  Script tapscript;
  std::vector<ByteData> script_stack;
  ByteData annex;
  TaprootUtil::ParseTaprootSignData(stack, &sig, &parity, &tapleaf_flag,
      &pk, &nodes, &tapscript, &script_stack, &annex);
  EXPECT_EQ("61f75636003a870b7a1685abae84eedf8c9527227ac70183c376f7b3a35b07ebcbea14749e58ce1a87565b035b2f3963baa5ae3ede95e89fd607ab7849f2087201", sig.GetHex(true));
  EXPECT_FALSE(parity);
  EXPECT_EQ(0, tapleaf_flag);
  EXPECT_FALSE(pk.IsValid());
  EXPECT_TRUE(nodes.empty());
  EXPECT_TRUE(tapscript.IsEmpty());
  EXPECT_TRUE(script_stack.empty());
  EXPECT_TRUE(annex.IsEmpty());
}